

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O2

void knote_index_RB_INSERT_COLOR(knote_index *head,knote *elm)

{
  knote *pkVar1;
  knote *pkVar2;
  knote *pkVar3;
  knote *pkVar4;
  anon_struct_32_4_548b78d9_for_kn_index *paVar5;
  knote *pkVar6;
  
  do {
    while( true ) {
      pkVar4 = (elm->kn_index).rbe_parent;
      if ((pkVar4 == (knote *)0x0) || ((pkVar4->kn_index).rbe_color != 1)) {
        (head->rbh_root->kn_index).rbe_color = 0;
        return;
      }
      pkVar1 = (pkVar4->kn_index).rbe_parent;
      pkVar6 = (pkVar1->kn_index).rbe_left;
      pkVar3 = elm;
      if (pkVar4 != pkVar6) break;
      pkVar2 = (pkVar1->kn_index).rbe_right;
      if ((pkVar2 != (knote *)0x0) && ((pkVar2->kn_index).rbe_color == 1)) {
        (pkVar2->kn_index).rbe_color = 0;
        goto LAB_0010345e;
      }
      pkVar2 = (pkVar4->kn_index).rbe_right;
      if (pkVar2 == elm) {
        pkVar6 = (pkVar2->kn_index).rbe_left;
        (pkVar4->kn_index).rbe_right = pkVar6;
        if (pkVar6 == (knote *)0x0) {
          (pkVar2->kn_index).rbe_parent = pkVar1;
LAB_00103542:
          pkVar6 = (pkVar4->kn_index).rbe_parent;
          paVar5 = (anon_struct_32_4_548b78d9_for_kn_index *)&(pkVar6->kn_index).rbe_right;
          if (pkVar4 == (pkVar6->kn_index).rbe_left) {
            paVar5 = &pkVar6->kn_index;
          }
        }
        else {
          (pkVar6->kn_index).rbe_parent = pkVar4;
          pkVar6 = (pkVar4->kn_index).rbe_parent;
          (pkVar2->kn_index).rbe_parent = pkVar6;
          paVar5 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
          if (pkVar6 != (knote *)0x0) goto LAB_00103542;
        }
        paVar5->rbe_left = pkVar2;
        (pkVar2->kn_index).rbe_left = pkVar4;
        (pkVar4->kn_index).rbe_parent = pkVar2;
        pkVar6 = (pkVar1->kn_index).rbe_left;
        pkVar3 = pkVar4;
        pkVar4 = elm;
      }
      (pkVar4->kn_index).rbe_color = 0;
      (pkVar1->kn_index).rbe_color = 1;
      pkVar4 = (pkVar6->kn_index).rbe_right;
      (pkVar1->kn_index).rbe_left = pkVar4;
      if (pkVar4 != (knote *)0x0) {
        (pkVar4->kn_index).rbe_parent = pkVar1;
      }
      pkVar4 = (pkVar1->kn_index).rbe_parent;
      (pkVar6->kn_index).rbe_parent = pkVar4;
      paVar5 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
      if (pkVar4 != (knote *)0x0) {
        paVar5 = (anon_struct_32_4_548b78d9_for_kn_index *)&(pkVar4->kn_index).rbe_right;
        if (pkVar1 == (pkVar4->kn_index).rbe_left) {
          paVar5 = &pkVar4->kn_index;
        }
      }
      paVar5->rbe_left = pkVar6;
      (pkVar6->kn_index).rbe_right = pkVar1;
LAB_001035ac:
      (pkVar1->kn_index).rbe_parent = pkVar6;
      elm = pkVar3;
    }
    if ((pkVar6 == (knote *)0x0) || ((pkVar6->kn_index).rbe_color != 1)) {
      pkVar6 = (pkVar4->kn_index).rbe_left;
      if (pkVar6 == elm) {
        pkVar3 = (pkVar6->kn_index).rbe_right;
        (pkVar4->kn_index).rbe_left = pkVar3;
        if (pkVar3 == (knote *)0x0) {
          (pkVar6->kn_index).rbe_parent = pkVar1;
LAB_001034d3:
          pkVar3 = (pkVar4->kn_index).rbe_parent;
          paVar5 = (anon_struct_32_4_548b78d9_for_kn_index *)&(pkVar3->kn_index).rbe_right;
          if (pkVar4 == (pkVar3->kn_index).rbe_left) {
            paVar5 = &pkVar3->kn_index;
          }
        }
        else {
          (pkVar3->kn_index).rbe_parent = pkVar4;
          pkVar3 = (pkVar4->kn_index).rbe_parent;
          (pkVar6->kn_index).rbe_parent = pkVar3;
          paVar5 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
          if (pkVar3 != (knote *)0x0) goto LAB_001034d3;
        }
        paVar5->rbe_left = pkVar6;
        (pkVar6->kn_index).rbe_right = pkVar4;
        (pkVar4->kn_index).rbe_parent = pkVar6;
        pkVar3 = pkVar4;
        pkVar4 = elm;
      }
      (pkVar4->kn_index).rbe_color = 0;
      (pkVar1->kn_index).rbe_color = 1;
      pkVar6 = (pkVar1->kn_index).rbe_right;
      pkVar4 = (pkVar6->kn_index).rbe_left;
      (pkVar1->kn_index).rbe_right = pkVar4;
      if (pkVar4 != (knote *)0x0) {
        (pkVar4->kn_index).rbe_parent = pkVar1;
      }
      pkVar4 = (pkVar1->kn_index).rbe_parent;
      (pkVar6->kn_index).rbe_parent = pkVar4;
      paVar5 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
      if (pkVar4 != (knote *)0x0) {
        paVar5 = (anon_struct_32_4_548b78d9_for_kn_index *)&(pkVar4->kn_index).rbe_right;
        if (pkVar1 == (pkVar4->kn_index).rbe_left) {
          paVar5 = &pkVar4->kn_index;
        }
      }
      paVar5->rbe_left = pkVar6;
      (pkVar6->kn_index).rbe_left = pkVar1;
      goto LAB_001035ac;
    }
    (pkVar6->kn_index).rbe_color = 0;
LAB_0010345e:
    (pkVar4->kn_index).rbe_color = 0;
    (pkVar1->kn_index).rbe_color = 1;
    elm = pkVar1;
  } while( true );
}

Assistant:

struct knote *
knote_new(void)
{
    struct knote *res;

    res = calloc(1, sizeof(struct knote));
    if (res == NULL)
        return (NULL);

    res->kn_ref = 1;

    return (res);
}